

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O1

void __thiscall
duckdb::RadixHTLocalSourceState::Finalize
          (RadixHTLocalSourceState *this,RadixHTGlobalSinkState *sink,
          RadixHTGlobalSourceState *gstate)

{
  unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
  *puVar1;
  pointer *ppLVar2;
  _Atomic_word *p_Var3;
  long lVar4;
  element_type *peVar5;
  __uniq_ptr_data<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true,_true>
  _Var6;
  undefined8 uVar7;
  undefined8 uVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  RadixHTLocalSourceState *pRVar10;
  int32_t val;
  int iVar11;
  reference this_00;
  type this_01;
  pointer pGVar12;
  idx_t *piVar13;
  ulong uVar14;
  TaskScheduler *this_02;
  unsigned_long uVar15;
  undefined4 extraout_var;
  idx_t iVar16;
  pointer pLVar17;
  type pTVar18;
  BufferManager *pBVar19;
  TupleDataCollection *this_03;
  pointer pTVar20;
  pointer this_04;
  unsafe_vector<unique_ptr<TupleDataCollection>_> *puVar21;
  pointer this_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  pointer radix_bits;
  pointer pLVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  unique_lock<std::mutex> guard;
  unique_lock<std::mutex> partition_guard;
  undefined1 local_70 [24];
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  pointer local_48;
  pointer local_40;
  RadixHTLocalSourceState *local_38;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_true>
            ::operator[](&sink->partitions,this->task_idx);
  this_01 = unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>
            ::operator*(this_00);
  pLVar22 = (pointer)&this->ht;
  local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sink;
  local_48 = pLVar22;
  local_38 = this;
  if ((this->ht).
      super_unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
      .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl ==
      (GroupedAggregateHashTable *)0x0) {
    puVar1 = &this_01->data;
    pTVar20 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
              ::operator->(puVar1);
    piVar13 = TupleDataCollection::Count(pTVar20);
    uVar14 = *piVar13;
    if (uVar14 < 0x1001) {
      uVar14 = 0x1000;
    }
    auVar23._8_4_ = (int)(uVar14 >> 0x20);
    auVar23._0_8_ = uVar14;
    auVar23._12_4_ = 0x45300000;
    dVar26 = ((auVar23._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar14) - 4503599627370496.0)) * 1.25;
    uVar14 = (ulong)dVar26;
    local_40 = (pointer)NextPowerOfTwo((long)(dVar26 - 9.223372036854776e+18) & (long)uVar14 >> 0x3f
                                       | uVar14);
    this_02 = TaskScheduler::GetScheduler(gstate->context);
    val = TaskScheduler::NumberOfThreads(this_02);
    uVar15 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
    pBVar19 = BufferManager::GetBufferManager(gstate->context);
    iVar11 = (*pBVar19->_vptr_BufferManager[0xb])(pBVar19);
    auVar24._4_4_ = extraout_var;
    auVar24._0_4_ = iVar11;
    auVar24._8_4_ = extraout_var;
    auVar24._12_4_ = 0x45300000;
    auVar25._8_4_ = (int)(uVar15 >> 0x20);
    auVar25._0_8_ = uVar15;
    auVar25._12_4_ = 0x45300000;
    dVar26 = (((auVar24._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,iVar11) - 4503599627370496.0)) * 0.6) /
             ((auVar25._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar15) - 4503599627370496.0));
    uVar14 = (ulong)dVar26;
    pTVar20 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
              ::operator->(puVar1);
    iVar16 = TupleDataCollection::SizeInBytes(pTVar20);
    pTVar20 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
              ::operator->(puVar1);
    piVar13 = TupleDataCollection::Count(pTVar20);
    pLVar22 = local_48;
    _Var9._M_pi = local_50._M_pi;
    pLVar17 = (pointer)NextPowerOfTwo(((long)(dVar26 - 9.223372036854776e+18) & (long)uVar14 >> 0x3f
                                      | uVar14) /
                                      (iVar16 / (*piVar13 + (ulong)(*piVar13 == 0)) + 10));
    radix_bits = (pointer)0x1000;
    if ((pointer)0x1000 < pLVar17) {
      radix_bits = pLVar17;
    }
    if (local_40 < radix_bits) {
      radix_bits = local_40;
    }
    RadixPartitionedHashTable::CreateHT
              ((RadixPartitionedHashTable *)local_70,
               (ClientContext *)_Var9._M_pi[9]._vptr__Sp_counted_base,(idx_t)gstate->context,
               (idx_t)radix_bits);
    uVar7 = local_70._0_8_;
    local_70._0_8_ = (GroupedAggregateHashTable *)0x0;
    uVar8 = local_70._0_8_;
    _Var6.
    super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
    .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl =
         *(__uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
           *)pLVar22;
    local_70[0] = (undefined1)uVar7;
    local_70[1] = SUB81(uVar7,1);
    local_70._2_6_ = SUB86(uVar7,2);
    pLVar22->id_ = local_70[0];
    pLVar22->physical_type_ = local_70[1];
    *(undefined6 *)&pLVar22->field_0x2 = local_70._2_6_;
    local_70._0_8_ = uVar8;
    if (_Var6.
        super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
        .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl !=
        (tuple<duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
         )0x0) {
      (**(code **)(*(long *)_Var6.
                            super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
                            .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>.
                            _M_head_impl + 8))();
    }
  }
  else {
    pGVar12 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
              ::operator->((unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
                            *)pLVar22);
    GroupedAggregateHashTable::Abandon(pGVar12);
  }
  pGVar12 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
            ::operator->((unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
                          *)pLVar22);
  puVar1 = &this_01->data;
  pTVar18 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
            ::operator*(puVar1);
  GroupedAggregateHashTable::Combine
            (pGVar12,pTVar18,(optional_ptr<std::atomic<double>,_true>)&this_01->progress);
  LOCK();
  (this_01->progress)._M_i = 1.0;
  UNLOCK();
  pBVar19 = BufferManager::GetBufferManager(gstate->context);
  peVar5 = (((RadixPartitionedHashTable *)local_50._M_pi[9]._vptr__Sp_counted_base)->layout_ptr).
           internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_70._8_8_ =
       (((RadixPartitionedHashTable *)local_50._M_pi[9]._vptr__Sp_counted_base)->layout_ptr).
       internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_)->_M_use_count + 1;
    }
  }
  this_03 = (TupleDataCollection *)operator_new(0x88);
  local_70._0_8_ = peVar5;
  TupleDataCollection::TupleDataCollection
            (this_03,pBVar19,(shared_ptr<duckdb::TupleDataLayout,_true> *)local_70);
  pLVar22 = local_48;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
  }
  ::std::
  __uniq_ptr_impl<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>::
  reset((__uniq_ptr_impl<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
         *)puVar1,this_03);
  pTVar20 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
            ::operator->(puVar1);
  unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
  ::operator->((unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
                *)pLVar22);
  GroupedAggregateHashTable::AcquirePartitionedData((GroupedAggregateHashTable *)local_70);
  this_04 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
            ::operator->((unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
                          *)local_70);
  _Var9._M_pi = local_50._M_pi;
  puVar21 = PartitionedTupleData::GetPartitions(this_04);
  pTVar18 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
            ::operator*((puVar21->
                        super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                        ).
                        super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  TupleDataCollection::Combine(pTVar20,pTVar18);
  if ((element_type *)local_70._0_8_ != (element_type *)0x0) {
    (**(code **)((long)(((vector<duckdb::LogicalType,_true> *)local_70._0_8_)->
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start + 8))();
  }
  local_70._0_8_ = _Var9._M_pi + 1;
  local_70._8_8_ = local_70._8_8_ & 0xffffffffffffff00;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_70);
  local_70[8] = 1;
  pGVar12 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
            ::operator->((unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
                          *)pLVar22);
  pRVar10 = local_38;
  local_70._16_8_ =
       (pGVar12->aggregate_allocator).internal.
       super___shared_ptr<duckdb::ArenaAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58 = (element_type *)
             (pGVar12->aggregate_allocator).internal.
             super___shared_ptr<duckdb::ArenaAllocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
  if (local_58 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ppLVar2 = &(local_58->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *(int *)ppLVar2 = *(int *)ppLVar2 + 1;
      UNLOCK();
    }
    else {
      ppLVar2 = &(local_58->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *(int *)ppLVar2 = *(int *)ppLVar2 + 1;
    }
  }
  ::std::
  vector<duckdb::shared_ptr<duckdb::ArenaAllocator,true>,std::allocator<duckdb::shared_ptr<duckdb::ArenaAllocator,true>>>
  ::emplace_back<duckdb::shared_ptr<duckdb::ArenaAllocator,true>>
            ((vector<duckdb::shared_ptr<duckdb::ArenaAllocator,true>,std::allocator<duckdb::shared_ptr<duckdb::ArenaAllocator,true>>>
              *)(_Var9._M_pi + 0xd),(shared_ptr<duckdb::ArenaAllocator,_true> *)(local_70 + 0x10));
  if (local_58 != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58);
  }
  if (pRVar10->task_idx ==
      (long)*(pointer *)&_Var9._M_pi[0xf]._M_use_count -
      (long)(((vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
               *)&_Var9._M_pi[0xf]._vptr__Sp_counted_base)->
            super__Vector_base<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
            )._M_impl.super__Vector_impl_data._M_start >> 3) {
    _Var6.
    super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
    .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl =
         *(__uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
           *)pLVar22;
    *(unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
      *)pLVar22 = (unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
                   )0x0;
    if (_Var6.
        super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
        .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl !=
        (tuple<duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
         )0x0) {
      (**(code **)(*(long *)_Var6.
                            super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
                            .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>.
                            _M_head_impl + 8))();
    }
  }
  LOCK();
  p_Var3 = &_Var9._M_pi[0x10]._M_use_count;
  lVar4 = *(long *)p_Var3;
  *(long *)p_Var3 = *(long *)p_Var3 + 1;
  UNLOCK();
  if (lVar4 + 1 ==
      (long)*(pointer *)&_Var9._M_pi[0xf]._M_use_count -
      (long)(((vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
               *)&_Var9._M_pi[0xf]._vptr__Sp_counted_base)->
            super__Vector_base<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
            )._M_impl.super__Vector_impl_data._M_start >> 3) {
    this_05 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
              ::operator->((unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
                            *)(_Var9._M_pi + 6));
    TemporaryMemoryState::SetZero(this_05);
  }
  local_70._16_8_ = &(this_01->super_StateWithBlockableTasks).lock;
  local_58 = (element_type *)((ulong)local_58 & 0xffffffffffffff00);
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)(local_70 + 0x10));
  local_58 = (element_type *)CONCAT71(local_58._1_7_,1);
  this_01->state = READY_TO_SCAN;
  StateWithBlockableTasks::UnblockTasks
            (&this_01->super_StateWithBlockableTasks,(unique_lock<std::mutex> *)(local_70 + 0x10));
  pRVar10->task = SCAN;
  pRVar10->scan_status = INIT;
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_70 + 0x10));
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_70);
  return;
}

Assistant:

void RadixHTLocalSourceState::Finalize(RadixHTGlobalSinkState &sink, RadixHTGlobalSourceState &gstate) {
	D_ASSERT(task == RadixHTSourceTaskType::FINALIZE);
	D_ASSERT(scan_status != RadixHTScanStatus::IN_PROGRESS);
	auto &partition = *sink.partitions[task_idx];

	if (!ht) {
		// This capacity would always be sufficient for all data
		const auto capacity = GroupedAggregateHashTable::GetCapacityForCount(partition.data->Count());

		// However, we will limit the initial capacity so we don't do a huge over-allocation
		const auto n_threads = NumericCast<idx_t>(TaskScheduler::GetScheduler(gstate.context).NumberOfThreads());
		const auto memory_limit = BufferManager::GetBufferManager(gstate.context).GetMaxMemory();
		const idx_t thread_limit = LossyNumericCast<idx_t>(0.6 * double(memory_limit) / double(n_threads));

		const idx_t size_per_entry = partition.data->SizeInBytes() / MaxValue<idx_t>(partition.data->Count(), 1) +
		                             idx_t(GroupedAggregateHashTable::LOAD_FACTOR * sizeof(ht_entry_t));
		// but not lower than the initial capacity
		const auto capacity_limit =
		    MaxValue(NextPowerOfTwo(thread_limit / size_per_entry), GroupedAggregateHashTable::InitialCapacity());

		ht = sink.radix_ht.CreateHT(gstate.context, MinValue<idx_t>(capacity, capacity_limit), 0);
	} else {
		ht->Abandon();
	}

	// Now combine the uncombined data using this thread's HT
	ht->Combine(*partition.data, &partition.progress);
	partition.progress = 1;

	// Move the combined data back to the partition
	partition.data =
	    make_uniq<TupleDataCollection>(BufferManager::GetBufferManager(gstate.context), sink.radix_ht.GetLayoutPtr());
	partition.data->Combine(*ht->AcquirePartitionedData()->GetPartitions()[0]);

	// Update thread-global state
	auto guard = sink.Lock();
	sink.stored_allocators.emplace_back(ht->GetAggregateAllocator());
	if (task_idx == sink.partitions.size()) {
		ht.reset();
	}
	const auto finalizes_done = ++sink.finalize_done;
	D_ASSERT(finalizes_done <= sink.partitions.size());
	if (finalizes_done == sink.partitions.size()) {
		// All finalizes are done, set remaining size to 0
		sink.temporary_memory_state->SetZero();
	}

	// Update partition state
	auto partition_guard = partition.Lock();
	partition.state = AggregatePartitionState::READY_TO_SCAN;
	partition.UnblockTasks(partition_guard);

	// This thread will scan the partition
	task = RadixHTSourceTaskType::SCAN;
	scan_status = RadixHTScanStatus::INIT;
}